

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeDropTable(Btree *p,int iTable,int *piMoved)

{
  int iVar1;
  undefined4 in_ESI;
  undefined8 in_RDI;
  Pgno iTable_00;
  Btree *unaff_retaddr;
  int rc;
  undefined4 in_stack_fffffffffffffff0;
  
  iTable_00 = (Pgno)((ulong)in_RDI >> 0x20);
  sqlite3BtreeEnter((Btree *)0x18a254);
  iVar1 = btreeDropTable(unaff_retaddr,iTable_00,(int *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  sqlite3BtreeLeave((Btree *)0x18a275);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeDropTable(Btree *p, int iTable, int *piMoved){
  int rc;
  sqlite3BtreeEnter(p);
  rc = btreeDropTable(p, iTable, piMoved);
  sqlite3BtreeLeave(p);
  return rc;
}